

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::IGXMLScanner::scanStartTag(IGXMLScanner *this,bool *gotData)

{
  Grammar *pGVar1;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  XMLAttDef *pXVar4;
  uint *this_00;
  bool bVar5;
  int iVar6;
  uint uVar7;
  AttTypes AVar8;
  undefined4 extraout_var;
  DTDElementDecl *pDVar9;
  XMLSize_t XVar10;
  XMLCh *pXVar11;
  QName *child;
  XMLReader *pXVar12;
  XMLAttr *pXVar13;
  XMLCh *pXVar14;
  UnexpectedEOFException *this_01;
  undefined4 extraout_var_00;
  XMLAttDef *pXVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong in_stack_fffffffffffffdd8;
  undefined4 uVar16;
  MemoryManager *in_stack_fffffffffffffde0;
  undefined4 uVar17;
  AttTypes local_144;
  AttTypes local_130;
  undefined1 local_c0 [7];
  bool res;
  XMLSize_t failure;
  XMLAttr *curAtt_1;
  uint *attCountPtr;
  XMLAttDef *pXStack_a0;
  DefAttTypes defType;
  XMLAttDef *curDef;
  XMLSize_t i;
  XMLAttDefList *attDefList;
  uint *puStack_80;
  XMLCh chFound_1;
  uint *curCountPtr;
  XMLAttr *curAtt;
  XMLAttDef *attDef;
  XMLCh *namePtr;
  XMLCh chFound;
  bool bFoundSpace;
  XMLSize_t XStack_58;
  XMLCh nextCh;
  XMLSize_t curAttListSize;
  XMLSize_t attCount;
  bool isRoot;
  DTDElementDecl *local_38;
  XMLElementDecl *elemDecl;
  XMLCh *rawQName;
  bool wasAdded;
  bool *pbStack_20;
  bool isEmpty;
  bool *gotData_local;
  IGXMLScanner *this_local;
  
  *gotData = true;
  pbStack_20 = gotData;
  gotData_local = (bool *)this;
  bVar5 = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,
                             &(this->super_XMLScanner).fQNameBuf);
  if (!bVar5) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
    return false;
  }
  rawQName._7_1_ = 0;
  rawQName._6_1_ = 0;
  elemDecl = (XMLElementDecl *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
  pGVar1 = (this->super_XMLScanner).fGrammar;
  iVar6 = (*(pGVar1->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar1,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,elemDecl,0xfffffffe)
  ;
  local_38 = (DTDElementDecl *)CONCAT44(extraout_var,iVar6);
  if (local_38 == (DTDElementDecl *)0x0) {
    local_38 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey
                         (this->fDTDElemNonDeclPool,(XMLCh *)elemDecl);
  }
  if (local_38 == (DTDElementDecl *)0x0) {
    rawQName._6_1_ = 1;
    pDVar9 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (pDVar9,(XMLCh *)elemDecl,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    local_38 = pDVar9;
    XVar10 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,pDVar9);
    XMLElementDecl::setId((XMLElementDecl *)pDVar9,XVar10);
  }
  if ((rawQName._6_1_ & 1) == 0) {
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (bVar5 = XMLElementDecl::isDeclared(&local_38->super_XMLElementDecl), !bVar5)) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
      XMLValidator::emitError
                (pXVar2,ElementNotDefined,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  else if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    XMLElementDecl::setCreateReason(&local_38->super_XMLElementDecl,JustFaultIn);
    pXVar2 = (this->super_XMLScanner).fValidator;
    pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    XMLValidator::emitError(pXVar2,ElementNotDefined,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
    ;
  }
  attCount._3_1_ = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  pDVar9 = local_38;
  XVar10 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  ElemStack::addLevel(&(this->super_XMLScanner).fElemStack,&pDVar9->super_XMLElementDecl,XVar10);
  ElemStack::setValidationFlag
            (&(this->super_XMLScanner).fElemStack,(bool)((this->super_XMLScanner).fValidate & 1));
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    pXVar2 = (this->super_XMLScanner).fValidator;
    (*pXVar2->_vptr_XMLValidator[9])(pXVar2,local_38);
  }
  if ((attCount._3_1_ & 1) == 0) {
    child = XMLElementDecl::getElementName(&local_38->super_XMLElementDecl);
    ElemStack::addChild(&(this->super_XMLScanner).fElemStack,child,true);
  }
  else {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       ((this->super_XMLScanner).fRootElemName != (XMLCh *)0x0)) {
      pXVar11 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
      bVar5 = XMLString::equals(pXVar11,(this->super_XMLScanner).fRootElemName);
      if (!bVar5) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
      }
    }
  }
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  curAttListSize = 0;
  XStack_58 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::size
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
  rawQName._6_1_ = 0;
  this->fElemCount = this->fElemCount + 1;
LAB_003519bd:
  namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  if (((curAttListSize != 0) && (namePtr._6_2_ != L'/')) && (namePtr._6_2_ != L'>')) {
    ReaderMgr::skipPastSpaces
              (&(this->super_XMLScanner).fReaderMgr,(bool *)((long)&namePtr + 5),false);
    if ((namePtr._5_1_ & 1) == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    }
    namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
  bVar5 = XMLReader::isSpecialStartTagChar(pXVar12,namePtr._6_2_);
  if (!bVar5) {
    bVar5 = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,
                               &(this->super_XMLScanner).fAttNameBuf);
    if (!bVar5) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      return false;
    }
    bVar5 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    uVar16 = (undefined4)(in_stack_fffffffffffffdd8 >> 0x20);
    if (!bVar5) goto code_r0x00351ac6;
    goto LAB_00351b8c;
  }
  if (namePtr._6_2_ == L'\0') {
    this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x77c,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,
                UnexpectedEOFException::~UnexpectedEOFException);
  }
  if (namePtr._6_2_ == L'/') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    rawQName._7_1_ = 1;
    bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    if (!bVar5) {
      pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else if (namePtr._6_2_ == L'>') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  else {
    if (namePtr._6_2_ != L'<') {
      if ((namePtr._6_2_ == L'\'') || (namePtr._6_2_ == L'\"')) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
        ReaderMgr::skipQuotedString(&(this->super_XMLScanner).fReaderMgr,namePtr._6_2_);
        ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      }
      goto LAB_003519bd;
    }
    pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedStartTag,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (curAttListSize != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  }
  uVar7 = (*(local_38->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])();
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  uVar16 = (undefined4)(in_stack_fffffffffffffdd8 >> 0x20);
  if ((uVar7 & 1) != 0) {
    iVar6 = (*(local_38->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])();
    i = CONCAT44(extraout_var_00,iVar6);
    curDef = (XMLAttDef *)0x0;
    while( true ) {
      pXVar4 = curDef;
      pXVar15 = (XMLAttDef *)(**(code **)(*(long *)i + 0x50))();
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      uVar16 = (undefined4)(in_stack_fffffffffffffdd8 >> 0x20);
      if (pXVar15 <= pXVar4) break;
      pXStack_a0 = (XMLAttDef *)(**(code **)(*(long *)i + 0x58))(i,curDef);
      attCountPtr._4_4_ = XMLAttDef::getDefaultType(pXStack_a0);
      curAtt_1 = (XMLAttr *)
                 RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                           (this->fAttDefRegistry,pXStack_a0);
      if ((curAtt_1 == (XMLAttr *)0x0) || (*(uint *)curAtt_1 < this->fElemCount)) {
        if (((this->super_XMLScanner).fValidate & 1U) != 0) {
          if (attCountPtr._4_4_ == Required) {
            pXVar2 = (this->super_XMLScanner).fValidator;
            iVar6 = (*(pXStack_a0->super_XSerializable)._vptr_XSerializable[5])();
            XMLValidator::emitError
                      (pXVar2,RequiredAttrNotProvided,(XMLCh *)CONCAT44(extraout_var_01,iVar6),
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          else if ((((attCountPtr._4_4_ == DefAttTypes_Min) || (attCountPtr._4_4_ == Fixed)) &&
                   (((this->super_XMLScanner).fStandalone & 1U) != 0)) &&
                  (bVar5 = XMLAttDef::isExternal(pXStack_a0), bVar5)) {
            pXVar2 = (this->super_XMLScanner).fValidator;
            iVar6 = (*(pXStack_a0->super_XSerializable)._vptr_XSerializable[5])();
            pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
            XMLValidator::emitError
                      (pXVar2,NoDefAttForStandalone,(XMLCh *)CONCAT44(extraout_var_02,iVar6),pXVar11
                       ,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        pXVar4 = pXStack_a0;
        if ((attCountPtr._4_4_ == DefAttTypes_Min) || (attCountPtr._4_4_ == Fixed)) {
          if (((this->super_XMLScanner).fValidate & 1U) != 0) {
            pXVar2 = (this->super_XMLScanner).fValidator;
            pXVar11 = XMLAttDef::getValue(pXStack_a0);
            (*pXVar2->_vptr_XMLValidator[8])(pXVar2,pXVar4,pXVar11,0,local_38);
          }
          if (curAttListSize < XStack_58) {
            pXVar13 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                (&((this->super_XMLScanner).fAttrList)->
                                  super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
            failure = (XMLSize_t)pXVar13;
            iVar6 = (*(pXStack_a0->super_XSerializable)._vptr_XSerializable[5])();
            pXVar11 = XMLAttDef::getValue(pXStack_a0);
            AVar8 = XMLAttDef::getType(pXStack_a0);
            in_stack_fffffffffffffdd8 = 0;
            in_stack_fffffffffffffde0 =
                 (MemoryManager *)((ulong)in_stack_fffffffffffffde0 & 0xffffffff00000000);
            XMLAttr::set(pXVar13,0,(XMLCh *)CONCAT44(extraout_var_04,iVar6),L"",pXVar11,AVar8,
                         (DatatypeValidator *)0x0,false);
            XMLAttr::setSpecified((XMLAttr *)failure,false);
          }
          else {
            pXVar13 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager)
            ;
            iVar6 = (*(pXStack_a0->super_XSerializable)._vptr_XSerializable[5])();
            pXVar11 = XMLAttDef::getValue(pXStack_a0);
            AVar8 = XMLAttDef::getType(pXStack_a0);
            in_stack_fffffffffffffde0 = (this->super_XMLScanner).fMemoryManager;
            in_stack_fffffffffffffdd8 = in_stack_fffffffffffffdd8 & 0xffffffff00000000;
            XMLAttr::XMLAttr(pXVar13,0,(XMLCh *)CONCAT44(extraout_var_03,iVar6),L"",pXVar11,AVar8,
                             false,in_stack_fffffffffffffde0,(DatatypeValidator *)0x0,false);
            failure = (XMLSize_t)pXVar13;
            BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                      (&((this->super_XMLScanner).fAttrList)->
                        super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,pXVar13);
            XStack_58 = XStack_58 + 1;
          }
          curAttListSize = curAttListSize + 1;
        }
      }
      curDef = (XMLAttDef *)((long)&(curDef->super_XSerializable)._vptr_XSerializable + 1);
    }
  }
  if ((rawQName._7_1_ & 1) != 0) {
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (pXVar2 = (this->super_XMLScanner).fValidator,
       uVar7 = (*pXVar2->_vptr_XMLValidator[2])(pXVar2,local_38,0,0,local_c0), (uVar7 & 1) == 0)) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
      iVar6 = (*(local_38->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])();
      XMLValidator::emitError
                (pXVar2,ElementNotValidForContent,pXVar11,(XMLCh *)CONCAT44(extraout_var_05,iVar6),
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    if ((attCount._3_1_ & 1) == 0) {
      bVar5 = ElemStack::getValidationFlag(&(this->super_XMLScanner).fElemStack);
      (this->super_XMLScanner).fValidate = bVar5;
    }
    else {
      *pbStack_20 = false;
    }
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pXVar3 = (this->super_XMLScanner).fDocHandler;
    (*pXVar3->_vptr_XMLDocumentHandler[0xb])
              (pXVar3,local_38,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
               (this->super_XMLScanner).fAttrList,curAttListSize,
               CONCAT44(uVar16,(uint)(rawQName._7_1_ & 1)),
               CONCAT44(uVar17,(uint)(attCount._3_1_ & 1)));
  }
  return true;
code_r0x00351ac6:
  XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
  namePtr._2_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"\'\"></");
  uVar16 = (undefined4)(in_stack_fffffffffffffdd8 >> 0x20);
  if ((namePtr._2_2_ != L'>') && (namePtr._2_2_ != L'/')) {
    if ((namePtr._2_2_ != L'\'') && (namePtr._2_2_ != L'\"')) {
      pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar5 = XMLReader::isWhitespace(pXVar12,namePtr._2_2_);
      if (!bVar5) {
        if (namePtr._2_2_ != L'<') {
          return false;
        }
        pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
LAB_00351b8c:
    attDef = (XMLAttDef *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
    curAtt = (XMLAttr *)DTDElementDecl::getAttDef(local_38,(XMLCh *)attDef);
    if (curAttListSize < XStack_58) {
      pXVar13 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&((this->super_XMLScanner).fAttrList)->
                            super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
      pXVar4 = attDef;
      curCountPtr = (uint *)pXVar13;
      if (curAtt == (XMLAttr *)0x0) {
        local_144 = AttTypes_Min;
      }
      else {
        local_144 = XMLAttDef::getType((XMLAttDef *)curAtt);
      }
      in_stack_fffffffffffffdd8 = 0;
      in_stack_fffffffffffffde0 =
           (MemoryManager *)((ulong)in_stack_fffffffffffffde0 & 0xffffffff00000000);
      XMLAttr::set(pXVar13,0,(XMLCh *)pXVar4,L"",L"",local_144,(DatatypeValidator *)0x0,false);
      XMLAttr::setSpecified((XMLAttr *)curCountPtr,true);
    }
    else {
      pXVar13 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      pXVar4 = attDef;
      if (curAtt == (XMLAttr *)0x0) {
        local_130 = AttTypes_Min;
      }
      else {
        local_130 = XMLAttDef::getType((XMLAttDef *)curAtt);
      }
      in_stack_fffffffffffffde0 = (this->super_XMLScanner).fMemoryManager;
      in_stack_fffffffffffffdd8 = CONCAT44(uVar16,1);
      XMLAttr::XMLAttr(pXVar13,0,(XMLCh *)pXVar4,L"",L"",local_130,true,in_stack_fffffffffffffde0,
                       (DatatypeValidator *)0x0,false);
      curCountPtr = (uint *)pXVar13;
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 pXVar13);
    }
    attDef = (XMLAttDef *)XMLAttr::getName((XMLAttr *)curCountPtr);
    if (curAtt == (XMLAttr *)0x0) {
      if (((this->super_XMLScanner).fValidate & 1U) != 0) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar11 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
        pXVar14 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLValidator::emitError
                  (pXVar2,AttNotDefinedForElement,pXVar11,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      bVar5 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                        (this->fUndeclaredAttrRegistry,attDef,0);
      pXVar4 = attDef;
      if (!bVar5) {
        pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,(XMLCh *)pXVar4,pXVar11,
                   (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      puStack_80 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                             (this->fAttDefRegistry,curAtt);
      if (puStack_80 == (uint *)0x0) {
        puStack_80 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
        *puStack_80 = this->fElemCount;
        RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                  (this->fAttDefRegistry,curAtt,puStack_80);
      }
      else if (*puStack_80 < this->fElemCount) {
        *puStack_80 = this->fElemCount;
      }
      else {
        pXVar11 = (XMLCh *)(**(code **)(*(long *)curAtt + 0x28))();
        pXVar14 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar11,pXVar14,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
    }
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar5 = scanAttValue(this,(XMLAttDef *)curAtt,(XMLCh *)attDef,
                         &(this->super_XMLScanner).fAttValueBuf);
    if (!bVar5) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      attDefList._6_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"></");
      if ((attDefList._6_2_ != L'>') && (attDefList._6_2_ != L'/')) {
        pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar5 = XMLReader::isWhitespace(pXVar12,attDefList._6_2_);
        if (!bVar5) {
          if (attDefList._6_2_ != L'<') {
            return false;
          }
          pXVar11 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          return false;
        }
      }
    }
    this_00 = curCountPtr;
    pXVar11 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
    XMLAttr::setValue((XMLAttr *)this_00,pXVar11);
    pXVar13 = curAtt;
    if ((curAtt != (XMLAttr *)0x0) && (((this->super_XMLScanner).fValidate & 1U) != 0)) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      pXVar11 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
      (*pXVar2->_vptr_XMLValidator[8])(pXVar2,pXVar13,pXVar11,0,local_38);
    }
    curAttListSize = curAttListSize + 1;
  }
  goto LAB_003519bd;
}

Assistant:

bool IGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We tell him to fault in a decl if he does not find one.
    //  Actually, we *don't* tell him to fault in a decl if he does not find one- NG
    bool wasAdded = false;
    const XMLCh *rawQName = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , rawQName
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look for it in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(rawQName);
    }
    if(!elemDecl)
    {
        // we're assuming this must be a DTD element.  DTD's can be
        // used with or without namespaces, but schemas cannot be used without
        // namespaces.
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            rawQName
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    //  We do something different here according to whether we found the
    //  element or not.
    if (wasAdded)
    {
        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }
    else
    {
        // If its not marked declared and validating, then emit an error
        if (fValidate && !elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setValidationFlag(fValidate);

    //  Validate the element
    if (fValidate)
        fValidator->validateElement(elemDecl);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(fQNameBuf.getRawBuffer(), fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );
                curAtt->setSpecified(true);
            }
            // reset namePtr so it refers to newly-allocated memory
            namePtr = (XMLCh *)curAtt->getName();

            if (!attDef)
            {
                //  If there is a validation handler, then we are validating
                //  so emit an error.
                if (fValidate)
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer()
                        , elemDecl->getFullName()
                    );
                }
                if(!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , namePtr
                        , elemDecl->getFullName()
                     );
                }
            }
            else
            {
                // prepare for duplicate detection
                unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                if(!curCountPtr)
                {
                    curCountPtr = getNewUIntPtr();
                    *curCountPtr = fElemCount;
                    fAttDefRegistry->put(attDef, curCountPtr);
                }
                else if(*curCountPtr < fElemCount)
                    *curCountPtr = fElemCount;
                else
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , attDef->getFullName()
                        , elemDecl->getFullName()
                    );
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(fAttValueBuf.getRawBuffer());

            //  Now that its all stretched out, lets look at its type and
            //  determine if it has a valid value. It will output any needed
            //  errors, but we just keep going. We only need to do this if
            //  we are validating.
            if (attDef)
            {
                // Let the validator pass judgement on the attribute value
                if (fValidate)
                {
                    fValidator->validateAttrValue
                    (
                        attDef
                        , fAttValueBuf.getRawBuffer()
                        , false
                        , elemDecl
                    );
                }
            }

            attCount++;
            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (elemDecl->hasAttDefs())
    {
        // N.B.:  this assumes DTD validation.
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            const XMLAttDef& curDef = attDefList.getAttDef(i);
            const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());

                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (attCount >= curAttListSize)
                    {
                        curAtt = new (fMemoryManager) XMLAttr
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                            , false
                            , fMemoryManager
                        );
                        fAttrList->addElement(curAtt);
                        curAttListSize++;
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(attCount);
                        curAtt->set
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                        );
                        curAtt->setSpecified(false);
                    }
                    attCount++;
                }
            }
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
        else {
            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}